

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::MarkConflicted
          (CWallet *this,uint256 *hashBlock,int conflicting_height,uint256 *hashTx)

{
  long in_FS_OFFSET;
  int conflictconfirms;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  int local_38;
  uint local_34;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs_wallet).super_recursive_mutex;
  local_30._M_owns = false;
  local_34 = conflicting_height;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  if ((-1 < (int)(this->m_last_block_processed_height | local_34)) &&
     (local_38 = local_34 + ~this->m_last_block_processed_height, local_38 < 0)) {
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x20);
    *(int **)local_58._M_unused._0_8_ = &local_38;
    *(CWallet **)((long)local_58._M_unused._0_8_ + 8) = this;
    *(uint256 **)((long)local_58._M_unused._0_8_ + 0x10) = hashBlock;
    *(uint **)((long)local_58._M_unused._0_8_ + 0x18) = &local_34;
    pcStack_40 = std::
                 _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1359:31)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<wallet::CWallet::TxUpdate_(wallet::CWalletTx_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1359:31)>
               ::_M_manager;
    RecursiveUpdateTxState(this,hashTx,(TryUpdatingStateFn *)&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::MarkConflicted(const uint256& hashBlock, int conflicting_height, const uint256& hashTx)
{
    LOCK(cs_wallet);

    // If number of conflict confirms cannot be determined, this means
    // that the block is still unknown or not yet part of the main chain,
    // for example when loading the wallet during a reindex. Do nothing in that
    // case.
    if (m_last_block_processed_height < 0 || conflicting_height < 0) {
        return;
    }
    int conflictconfirms = (m_last_block_processed_height - conflicting_height + 1) * -1;
    if (conflictconfirms >= 0)
        return;

    auto try_updating_state = [&](CWalletTx& wtx) EXCLUSIVE_LOCKS_REQUIRED(cs_wallet) {
        if (conflictconfirms < GetTxDepthInMainChain(wtx)) {
            // Block is 'more conflicted' than current confirm; update.
            // Mark transaction as conflicted with this block.
            wtx.m_state = TxStateBlockConflicted{hashBlock, conflicting_height};
            return TxUpdate::CHANGED;
        }
        return TxUpdate::UNCHANGED;
    };

    // Iterate over all its outputs, and mark transactions in the wallet that spend them conflicted too.
    RecursiveUpdateTxState(hashTx, try_updating_state);

}